

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall
IRBuilder::BuildElementU
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot instance,
          PropertyIdIndexType propertyIdIndex)

{
  bool bVar1;
  PropertyId propertyId_00;
  RegSlot RVar2;
  JITTimeFunctionBody *pJVar3;
  StackSym *pSVar4;
  ByteCodeUsesInstr *this_00;
  RegOpnd *pRVar5;
  IntConstOpnd *newSrc;
  SymOpnd *pSVar6;
  IntConstOpnd *src2Opnd;
  RegOpnd *src1Opnd;
  PropertyKind propertyKind;
  ByteCodeUsesInstr *byteCodeUse;
  bool reuseLoc;
  PropertyId propertyId;
  SymOpnd *fieldSymOpnd;
  RegOpnd *regOpnd;
  Instr *instr;
  PropertyIdIndexType propertyIdIndex_local;
  RegSlot instance_local;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  pJVar3 = Func::GetJITFunctionBody(this->m_func);
  propertyId_00 = JITTimeFunctionBody::GetReferencedPropertyId(pJVar3,propertyIdIndex);
  byteCodeUse._3_1_ = false;
  if (newOpcode == LdElemUndefScoped) {
    pSVar6 = BuildFieldOpnd(this,LdElemUndefScoped,instance,propertyId_00,propertyIdIndex,
                            PropertyKindData,0xffffffff);
    pRVar5 = BuildSrcOpnd(this,1,TyVar);
    regOpnd = (RegOpnd *)
              IR::Instr::New(LdElemUndefScoped,&pSVar6->super_Opnd,&pRVar5->super_Opnd,this->m_func)
    ;
  }
  else if (newOpcode == StLocalFuncExpr) {
    pJVar3 = Func::GetJITFunctionBody(this->m_func);
    RVar2 = JITTimeFunctionBody::GetLocalClosureReg(pJVar3);
    pSVar6 = BuildFieldOpnd(this,StLocalFuncExpr,RVar2,propertyId_00,propertyIdIndex,
                            PropertyKindData,0xffffffff);
    pRVar5 = BuildSrcOpnd(this,instance,TyVar);
    regOpnd = (RegOpnd *)
              IR::Instr::New(StFuncExpr,&pSVar6->super_Opnd,&pRVar5->super_Opnd,this->m_func);
  }
  else {
    if (newOpcode != DeleteLocalFld) {
      if (newOpcode != DeleteLocalFld_ReuseLoc) {
        if (newOpcode == LdLocalElemUndef) {
          pSVar4 = Func::GetLocalClosureSym(this->m_func);
          bVar1 = StackSym::HasByteCodeRegSlot(pSVar4);
          if (bVar1) {
            this_00 = IR::ByteCodeUsesInstr::New(this->m_func,offset);
            pSVar4 = Func::GetLocalClosureSym(this->m_func);
            IR::ByteCodeUsesInstr::SetNonOpndSymbol(this_00,(pSVar4->super_Sym).m_id);
            AddInstr(this,&this_00->super_Instr,offset);
          }
          pJVar3 = Func::GetJITFunctionBody(this->m_func);
          RVar2 = JITTimeFunctionBody::GetLocalClosureReg(pJVar3);
          pSVar6 = BuildFieldOpnd(this,LdElemUndef,RVar2,propertyId_00,propertyIdIndex,
                                  PropertyKindData,0xffffffff);
          regOpnd = (RegOpnd *)IR::Instr::New(LdElemUndef,&pSVar6->super_Opnd,this->m_func);
        }
        else if (newOpcode == ClearAttributes) {
          regOpnd = (RegOpnd *)IR::Instr::New(ClearAttributes,this->m_func);
          pRVar5 = BuildSrcOpnd(this,instance,TyVar);
          newSrc = IR::IntConstOpnd::New((long)propertyId_00,TyInt32,this->m_func,false);
          IR::Instr::SetSrc1((Instr *)regOpnd,&pRVar5->super_Opnd);
          IR::Instr::SetSrc2((Instr *)regOpnd,&newSrc->super_Opnd);
        }
        else {
          pSVar6 = BuildFieldOpnd(this,newOpcode,instance,propertyId_00,propertyIdIndex,
                                  PropertyKindData,0xffffffff);
          regOpnd = (RegOpnd *)IR::Instr::New(newOpcode,&pSVar6->super_Opnd,this->m_func);
        }
        goto LAB_0064c8eb;
      }
      byteCodeUse._3_1_ = true;
    }
    pJVar3 = Func::GetJITFunctionBody(this->m_func);
    RVar2 = JITTimeFunctionBody::GetLocalClosureReg(pJVar3);
    pSVar6 = BuildFieldOpnd(this,DeleteFld,RVar2,propertyId_00,propertyIdIndex,PropertyKindData,
                            0xffffffff);
    pRVar5 = BuildDstOpnd(this,instance,TyVar,false,byteCodeUse._3_1_);
    regOpnd = (RegOpnd *)
              IR::Instr::New(DeleteFld,&pRVar5->super_Opnd,&pSVar6->super_Opnd,this->m_func);
  }
LAB_0064c8eb:
  AddInstr(this,(Instr *)regOpnd,offset);
  return;
}

Assistant:

void
IRBuilder::BuildElementU(Js::OpCode newOpcode, uint32 offset, Js::RegSlot instance, Js::PropertyIdIndexType propertyIdIndex)
{
    IR::Instr *     instr;
    IR::RegOpnd *   regOpnd;
    IR::SymOpnd *   fieldSymOpnd;
    Js::PropertyId propertyId = m_func->GetJITFunctionBody()->GetReferencedPropertyId(propertyIdIndex);
    bool            reuseLoc = false;

    switch (newOpcode)
    {
        case Js::OpCode::LdLocalElemUndef:
            if (m_func->GetLocalClosureSym()->HasByteCodeRegSlot())
            {
                IR::ByteCodeUsesInstr * byteCodeUse = IR::ByteCodeUsesInstr::New(m_func, offset);
                byteCodeUse->SetNonOpndSymbol(m_func->GetLocalClosureSym()->m_id);
                this->AddInstr(byteCodeUse, offset);
            }

            instance = m_func->GetJITFunctionBody()->GetLocalClosureReg();
            newOpcode = Js::OpCode::LdElemUndef;
            fieldSymOpnd = this->BuildFieldOpnd(newOpcode, instance, propertyId, propertyIdIndex, PropertyKindData);
            instr = IR::Instr::New(newOpcode, fieldSymOpnd, m_func);
            break;

            // fall through
        case Js::OpCode::LdElemUndefScoped:
        {
             // Store
            PropertyKind propertyKind = PropertyKindData;
            fieldSymOpnd = this->BuildFieldOpnd(newOpcode, instance, propertyId, propertyIdIndex, propertyKind);
            // Implicit root object as default instance
            regOpnd = this->BuildSrcOpnd(Js::FunctionBody::RootObjectRegSlot);

            instr = IR::Instr::New(newOpcode, fieldSymOpnd, regOpnd, m_func);
            break;
        }
        case Js::OpCode::ClearAttributes:
        {
            instr = IR::Instr::New(newOpcode, m_func);
            IR::RegOpnd * src1Opnd = this->BuildSrcOpnd(instance);
            IR::IntConstOpnd * src2Opnd = IR::IntConstOpnd::New(propertyId, TyInt32, m_func);

            instr->SetSrc1(src1Opnd);
            instr->SetSrc2(src2Opnd);
            break;
        }

        case Js::OpCode::StLocalFuncExpr:
            fieldSymOpnd = this->BuildFieldOpnd(newOpcode, m_func->GetJITFunctionBody()->GetLocalClosureReg(), propertyId, propertyIdIndex, PropertyKindData);
            regOpnd = this->BuildSrcOpnd(instance);
            newOpcode = Js::OpCode::StFuncExpr;
            instr = IR::Instr::New(newOpcode, fieldSymOpnd, regOpnd, m_func);
            break;

        case Js::OpCode::DeleteLocalFld_ReuseLoc:
            newOpcode = Js::OpCode::DeleteLocalFld;
            reuseLoc = true;
            // fall through
        case Js::OpCode::DeleteLocalFld:
            newOpcode = Js::OpCode::DeleteFld;
            fieldSymOpnd = BuildFieldOpnd(newOpcode, m_func->GetJITFunctionBody()->GetLocalClosureReg(), propertyId, propertyIdIndex, PropertyKindData);
            regOpnd = BuildDstOpnd(instance, TyVar, false, reuseLoc);
            instr = IR::Instr::New(newOpcode, regOpnd, fieldSymOpnd, m_func);
            break;

        default:
        {
            fieldSymOpnd = this->BuildFieldOpnd(newOpcode, instance, propertyId, propertyIdIndex, PropertyKindData);

            instr = IR::Instr::New(newOpcode, fieldSymOpnd, m_func);
            break;
        }
    }

    this->AddInstr(instr, offset);
}